

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O2

void __thiscall mocker::detail::RegisterAllocator::allocate(RegisterAllocator *this)

{
  InterferenceGraph *this_00;
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  ostream *poVar4;
  shared_ptr<mocker::nasm::Register> *reg;
  pointer psVar5;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  toBeSpilled;
  RegMap<Node> coloring;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  nonPrecolored;
  undefined1 local_17a;
  undefined1 local_179;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_178;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  undefined4 local_138;
  undefined8 local_130;
  __node_base_ptr p_Stack_128;
  _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_120;
  MoveInfo *local_118;
  pointer local_110;
  _Any_data *local_108;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_d8;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
  local_80;
  
  this_00 = &this->interG;
  local_118 = &this->moveInfo;
  local_120 = &(this->spilledLastTime)._M_h;
  do {
    getNonPrecoloredNodes(&local_d8,(this->funcBeg)._M_node,(this->funcEnd)._M_node);
    InterferenceGraph::clearAndInit(this_00,&local_d8);
    local_f8._8_8_ = 0;
    local_e0 = std::
               _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:467:22)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:467:22)>
               ::_M_manager;
    local_a0._8_8_ = 0;
    local_88 = std::
               _Function_handler<bool_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:472:24)>
               ::_M_invoke;
    local_c0._8_8_ = 0;
    local_90 = std::
               _Function_handler<bool_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:472:24)>
               ::_M_manager;
    local_a8 = std::
               _Function_handler<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:475:22)>
               ::_M_invoke;
    local_b0 = std::
               _Function_handler<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:475:22)>
               ::_M_manager;
    local_f8._M_unused._M_object = this;
    local_c0._M_unused._M_object = this;
    local_a0._M_unused._M_object = this;
    InterferenceGraph::bindFunctions
              (this_00,(function<void_(const_std::shared_ptr<mocker::nasm::Register>_&)> *)&local_f8
               ,(function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)> *)&local_a0,
               (function<std::vector<std::shared_ptr<mocker::nasm::Mov>,_std::allocator<std::shared_ptr<mocker::nasm::Mov>_>_>_(const_std::shared_ptr<mocker::nasm::Register>_&)>
                *)&local_c0);
    std::_Function_base::~_Function_base((_Function_base *)&local_c0);
    std::_Function_base::~_Function_base((_Function_base *)&local_a0);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    MoveInfo::clearAndInit(local_118,&local_d8);
    local_80.first.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.second._M_h._M_buckets =
         (__buckets_ptr)
         std::
         _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:485:9)>
         ::_M_invoke;
    local_158._8_8_ = 0;
    local_80.first.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:485:9)>
                  ::_M_manager;
    pcStack_140 = std::
                  _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:486:9)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(const_std::shared_ptr<mocker::nasm::Mov>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp:486:9)>
                ::_M_manager;
    local_158._M_unused._M_object = this;
    local_80.first.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    InterferenceGraph::build
              (this_00,(this->funcBeg)._M_node,(this->funcEnd)._M_node,
               (function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)&local_80,
               (function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)&local_158);
    std::_Function_base::~_Function_base((_Function_base *)&local_158);
    std::_Function_base::~_Function_base((_Function_base *)&local_80);
    InterferenceGraph::initWorklists(this_00,&local_d8);
    do {
      do {
        do {
          do {
            bVar3 = InterferenceGraph::simplify(this_00);
          } while (bVar3);
          bVar3 = coalesce(this);
        } while (bVar3);
        bVar3 = InterferenceGraph::freezeNode(this_00);
      } while (bVar3);
      bVar3 = InterferenceGraph::spill(this_00);
    } while (bVar3);
    local_178.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158._M_unused._M_object = &p_Stack_128;
    local_158._8_8_ = 1;
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_138 = 0x3f800000;
    local_130 = 0;
    p_Stack_128 = (__node_base_ptr)0x0;
    InterferenceGraph::assignColors(&local_80,this_00);
    local_108 = &local_158;
    local_100 = &local_178;
    std::
    tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
    ::operator=((tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
                 *)&local_108,&local_80);
    std::
    pair<std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>_>_>
    ::~pair(&local_80);
    psVar1 = local_178.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_110 = local_178.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (local_178.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_178.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      color(this,(RegMap<Node> *)&local_158);
    }
    else {
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
                ((_Hashtable<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>,std::__detail::_Identity,mocker::nasm::RegPtrEqual,mocker::nasm::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_80,
                 local_178.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_178.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,
                 (tuple<std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>&,std::unordered_map<std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::pair<std::shared_ptr<mocker::nasm::Register>const,std::shared_ptr<mocker::nasm::Register>>>>&>
                  *)&local_108,&local_179,&local_17a);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::operator=(local_120,
                  (_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_80);
      std::
      _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>,_std::__detail::_Identity,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&local_80);
      std::operator<<((ostream *)&std::cerr,"\nto be spilled: ");
      psVar2 = local_178.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar5 = local_178.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1
          ) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 (string *)
                                 &((psVar5->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->identifier);
        std::operator<<(poVar4,", ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      rewriteProgram(this,&local_178);
    }
    std::
    _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_158);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_178);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~vector(&local_d8);
  } while (local_110 != psVar1);
  return;
}

Assistant:

void RegisterAllocator::allocate() {
  auto enableMoves = [this](const Node &n) {
    auto movs = moveInfo.getCurAssociatedMoves(n);
    for (auto &mov : movs)
      moveInfo.enableMove(mov);
  };
  auto isMoveRelated = [this](const Node &n) {
    return moveInfo.isMoveRelated(n);
  };
  auto freezeMoves = [this](const Node &n) { return moveInfo.freezeMoves(n); };

  while (true) {
    auto nonPrecolored = getNonPrecoloredNodes(funcBeg, funcEnd);
    interG.clearAndInit(nonPrecolored);
    interG.bindFunctions(enableMoves, isMoveRelated, freezeMoves);
    moveInfo.clearAndInit(nonPrecolored);

    interG.build(
        funcBeg, funcEnd,
        [this](const MovInst &mov) { moveInfo.pushWorklist(mov); },
        [this](const MovInst &mov) { moveInfo.updateAssociatedMoves(mov); });
    interG.initWorklists(nonPrecolored);

    while (true) {
      if (interG.simplify())
        continue;
      if (coalesce())
        continue;
      if (interG.freezeNode())
        continue;
      if (interG.spill())
        continue;
      break;
    }

    std::vector<Node> toBeSpilled;
    RegMap<Node> coloring;
    std::tie(toBeSpilled, coloring) = interG.assignColors();
    if (toBeSpilled.empty()) {
      color(coloring);
      break;
    }
    spilledLastTime = RegSet(toBeSpilled.begin(), toBeSpilled.end());
    std::cerr << "\nto be spilled: ";
    for (auto &reg : toBeSpilled)
      std::cerr << reg->getIdentifier() << ", ";
    std::cerr << std::endl;
    rewriteProgram(toBeSpilled);
  }
}